

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_shl_16(c_v64 a,uint n)

{
  uint in_ESI;
  int c;
  c_v64 t;
  int local_18;
  short local_10 [4];
  c_v64 local_8;
  
  if (0xf < in_ESI) {
    fprintf(_stderr,"Error: Undefined u16 shift left %d\n",(ulong)in_ESI);
    abort();
  }
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    *(short *)((long)&local_8 + (long)local_18 * 2) = local_10[local_18] << ((byte)in_ESI & 0x1f);
  }
  return (c_v64)local_8.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift left %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = (uint16_t)(a.u16[c] << n);
  return t;
}